

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(data_view *data,DataType baseType,bool *val)

{
  string_view val_00;
  string_view val_01;
  bool bVar1;
  long lVar2;
  invalid_argument *this;
  double dVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  size_t sStack_48;
  vector<double,_std::allocator<double>_> value;
  undefined8 local_20;
  
  switch(baseType) {
  case HELICS_DOUBLE:
    dVar3 = ValueConverter<double>::interpret(data);
    goto LAB_001c5f2e;
  case HELICS_INT:
  case HELICS_TIME:
    lVar2 = ValueConverter<long>::interpret(data);
    *val = lVar2 != 0;
    break;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::interpret(data);
    dVar3 = std::abs<double>((complex<double> *)&value);
LAB_001c5f2e:
    *val = dVar3 != 0.0;
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret(&value,data);
    dVar3 = vectorNorm(&value);
    *val = dVar3 != 0.0;
    CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&value);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&value,data);
    dVar3 = vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       &value);
    *val = dVar3 != 0.0;
    CLI::std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::
    ~_Vector_base((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                  &value);
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)&value,data);
    if (value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      *val = true;
LAB_001c5ffd:
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value,"value");
      if ((((bVar1) ||
           (value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish == (pointer)0x0)) && ((double)local_20 == 0.0)) &&
         (!NAN((double)local_20))) {
        *val = false;
      }
    }
    else {
      val_01._M_str =
           (char *)value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      val_01._M_len = sStack_48;
      bVar1 = helicsBoolValue(val_01);
      *val = bVar1;
      if (bVar1) goto LAB_001c5ffd;
    }
    std::__cxx11::string::~string((string *)&value);
    break;
  case HELICS_BOOL:
    __x = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data);
    __y._M_str = "0";
    __y._M_len = 1;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)__x,__y);
    bVar1 = !bVar1;
LAB_001c5f68:
    *val = bVar1;
    break;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)&value,(helics *)data,(data_view *)val);
      valueExtract((defV *)&value,val);
    }
    else {
      if (baseType != HELICS_ANY) {
        if (baseType == HELICS_CUSTOM) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"unrecognized helics type");
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data);
        val_00._M_str =
             (char *)value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        val_00._M_len = sStack_48;
        bVar1 = helicsBoolValue(val_00);
        goto LAB_001c5f68;
      }
      value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      valueExtract(data,HELICS_ANY,(defV *)&value);
      valueExtract((defV *)&value,val);
    }
    CLI::std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&value);
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, bool& val)
{
    switch (baseType) {
        case DataType::HELICS_ANY: {
            defV val_dv;
            valueExtract(data, baseType, val_dv);
            valueExtract(val_dv, val);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default:
            val = helicsBoolValue(ValueConverter<std::string_view>::interpret(data));
            break;
        case DataType::HELICS_BOOL:
            val = (ValueConverter<std::string_view>::interpret(data) != "0");
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            auto& str = npval.name;
            val = str.empty() || helicsBoolValue(str);
            if (val) {
                if ((str == "value" || str.empty()) && npval.value == 0.0) {
                    val = false;
                }
            }

            break;
        }
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val = std::abs(value) != 0;
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val = (value != 0);
            break;
        }

        case DataType::HELICS_VECTOR: {
            auto value = ValueConverter<std::vector<double>>::interpret(data);
            val = (vectorNorm(value) != 0.0);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto value = ValueConverter<std::complex<double>>::interpret(data);
            val = (std::abs(value) != 0.0);
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto value = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = (vectorNorm(value) != 0.0);
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
        case DataType::HELICS_CUSTOM:
            throw(std::invalid_argument("unrecognized helics type"));
    }
}